

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall psy::C::Lexer::lexIntegerOrFloatingConstant(Lexer *this,SyntaxToken *tk)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ParseOptions *this_00;
  LanguageDialect *pLVar4;
  int iVar5;
  string local_48;
  
  iVar5 = (int)this->yytext_ + -1;
  if (this->yytext_[-1] != '0') goto LAB_002bc613;
  bVar1 = this->yychar_;
  if (bVar1 < 0x58) {
    if (bVar1 == 0) goto LAB_002bc613;
    if (bVar1 != 0x42) {
LAB_002bc5f9:
      if ((bVar1 & 0xf8) != 0x30) {
LAB_002bc613:
        do {
          bVar1 = this->yychar_;
          if (bVar1 < 0x45) {
            if (bVar1 == 0) goto LAB_002bc5b2;
            if (bVar1 == 0x2e) {
              yyinput(this);
              lexFloatingOrImaginaryFloating_AtFollowOfPeriod
                        (this,tk,*(int *)&this->yytext_ - iVar5);
              return;
            }
          }
          else if ((bVar1 == 0x45) || (bVar1 == 0x65)) {
            lexExponentPart(this);
            lexFloatingOrImaginaryFloatingSuffix(this,tk,*(int *)&this->yytext_ - iVar5);
            return;
          }
          if (9 < bVar1 - 0x30) goto LAB_002bc5b2;
          yyinput(this);
        } while( true );
      }
      do {
        yyinput(this);
      } while ((this->yychar_ & 0xf8) == 0x30);
      goto LAB_002bc5b2;
    }
LAB_002bc5a0:
    do {
      yyinput(this);
    } while ((this->yychar_ & 0xfe) == 0x30);
  }
  else {
    if (bVar1 != 0x78) {
      if (bVar1 == 0x62) goto LAB_002bc5a0;
      if (bVar1 != 0x58) goto LAB_002bc5f9;
    }
    do {
      do {
        yyinput(this);
      } while (this->yychar_ - 0x30 < 10);
      uVar3 = this->yychar_ - 0x2e;
      if (0x38 < uVar3) goto LAB_002bc5b2;
    } while ((0x1f8000001f80000U >> ((ulong)uVar3 & 0x3f) & 1) != 0);
    if ((ulong)uVar3 == 0) {
      tk->syntaxK_ = FloatingConstantToken;
      yyinput(this);
      this_00 = SyntaxTree::parseOptions(this->tree_);
      pLVar4 = ParseOptions::languageDialect(this_00);
      bVar2 = operator<(pLVar4->std_,C99);
      if (bVar2) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"hexadecimal floating-point constant","");
        DiagnosticsReporter::IncompatibleLanguageDialect(&this->diagReporter_,&local_48,C99);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      while ((this->yychar_ - 0x30 < 10 ||
             ((uVar3 = this->yychar_ - 0x41, uVar3 < 0x26 &&
              ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) != 0))))) {
        yyinput(this);
      }
      lexBinaryExponentPart(this);
      lexFloatingOrImaginaryFloatingSuffix(this,tk,*(int *)&this->yytext_ - iVar5);
      return;
    }
  }
LAB_002bc5b2:
  lexIntegerOrImaginaryIntegerSuffix(this,tk,*(int *)&this->yytext_ - iVar5);
  return;
}

Assistant:

void Lexer::lexIntegerOrFloatingConstant(SyntaxToken* tk)
{
    const char* yytext = yytext_ - 1;

    if (*yytext == '0' && yychar_) {
        if (yychar_ == 'x'|| yychar_ == 'X') {
            yyinput();
            lexHexadecimalDigitSequence();

            if (yychar_ == '.') {
                tk->syntaxK_ = SyntaxKind::FloatingConstantToken;
                yyinput();

                if (tree_->parseOptions().languageDialect().std() < LanguageDialect::Std::C99) {
                    diagReporter_.IncompatibleLanguageDialect(
                                "hexadecimal floating-point constant",
                                LanguageDialect::Std::C99);
                }

                lexHexadecimalDigitSequence();
                lexBinaryExponentPart();
                lexFloatingOrImaginaryFloatingSuffix(tk, yytext_ - yytext);
                return;
            }
            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ == 'b' || yychar_ == 'B') {
            yyinput();
            while (yychar_ == '0' || yychar_ == '1')
                yyinput();
            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ >= '0' && yychar_ <= '7') {
            do {
                yyinput();
            }
            while (yychar_ >= '0' && yychar_ <= '7');

            lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
            return;
        }
    }

    while (yychar_) {
        if (yychar_ == '.') {
            yyinput();
            lexFloatingOrImaginaryFloating_AtFollowOfPeriod(tk, yytext_ - yytext);
            return;
        }

        if (yychar_ == 'e' || yychar_ == 'E') {
            lexFloatingOrImaginaryFloating_AtExponent(tk, yytext_ - yytext);
            return;
        }

        if (!std::isdigit(yychar_))
            break;
        yyinput();
    }

    lexIntegerOrImaginaryIntegerSuffix(tk, yytext_ - yytext);
}